

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

ImDrawList * __thiscall ImDrawList::CloneOutput(ImDrawList *this)

{
  int iVar1;
  int iVar2;
  ImDrawListSharedData *pIVar3;
  ImDrawCmd *pIVar4;
  unsigned_short *puVar5;
  ImDrawVert *pIVar6;
  ImDrawList *pIVar7;
  ImDrawCmd *__dest;
  unsigned_short *__dest_00;
  ImDrawVert *__dest_01;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined1 auVar10 [32];
  
  pIVar7 = (ImDrawList *)ImGui::MemAlloc(200);
  pIVar3 = this->_Data;
  auVar10 = ZEXT1632(ZEXT816(0) << 0x40);
  auVar9 = auVar10._0_16_;
  (pIVar7->VtxBuffer).Size = auVar9._0_4_;
  (pIVar7->VtxBuffer).Capacity = auVar9._4_4_;
  (pIVar7->VtxBuffer).Data = (ImDrawVert *)auVar9._8_8_;
  pIVar7->Flags = auVar10._16_4_;
  pIVar7->_VtxCurrentIdx = auVar10._20_4_;
  pIVar7->_Data = (ImDrawListSharedData *)auVar10._24_8_;
  auVar9 = auVar10._0_16_;
  auVar11 = auVar10._16_16_;
  (pIVar7->CmdBuffer).Size = auVar9._0_4_;
  (pIVar7->CmdBuffer).Capacity = auVar9._4_4_;
  (pIVar7->CmdBuffer).Data = (ImDrawCmd *)auVar9._8_8_;
  (pIVar7->IdxBuffer).Size = auVar11._0_4_;
  (pIVar7->IdxBuffer).Capacity = auVar11._4_4_;
  (pIVar7->IdxBuffer).Data = (unsigned_short *)auVar11._8_8_;
  auVar10 = ZEXT1632(ZEXT816(0) << 0x40);
  pIVar7->_OwnerName = (char *)auVar10._0_8_;
  pIVar7->_VtxWritePtr = (ImDrawVert *)auVar10._8_8_;
  pIVar7->_IdxWritePtr = (ImDrawIdx *)auVar10._16_8_;
  (pIVar7->_ClipRectStack).Size = auVar10._24_4_;
  (pIVar7->_ClipRectStack).Capacity = auVar10._28_4_;
  *(undefined1 (*) [32])&(pIVar7->_ClipRectStack).Data = auVar10;
  *(undefined1 (*) [32])&(pIVar7->_Path).Data = auVar10;
  *(undefined1 (*) [32])&(pIVar7->_CmdHeader).VtxOffset = auVar10;
  *(undefined8 *)&pIVar7->_FringeScale = 0;
  pIVar7->_Data = pIVar3;
  pIVar4 = (pIVar7->CmdBuffer).Data;
  if (pIVar4 != (ImDrawCmd *)0x0) {
    (pIVar7->CmdBuffer).Size = 0;
    (pIVar7->CmdBuffer).Capacity = 0;
    ImGui::MemFree(pIVar4);
    (pIVar7->CmdBuffer).Data = (ImDrawCmd *)0x0;
  }
  iVar1 = (this->CmdBuffer).Size;
  iVar2 = (pIVar7->CmdBuffer).Capacity;
  if (iVar2 < iVar1) {
    if (iVar2 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar2 / 2 + iVar2;
    }
    if (iVar8 <= iVar1) {
      iVar8 = iVar1;
    }
    if (iVar2 < iVar8) {
      __dest = (ImDrawCmd *)ImGui::MemAlloc((long)iVar8 * 0x38);
      pIVar4 = (pIVar7->CmdBuffer).Data;
      if (pIVar4 != (ImDrawCmd *)0x0) {
        memcpy(__dest,pIVar4,(long)(pIVar7->CmdBuffer).Size * 0x38);
        ImGui::MemFree((pIVar7->CmdBuffer).Data);
      }
      (pIVar7->CmdBuffer).Data = __dest;
      (pIVar7->CmdBuffer).Capacity = iVar8;
    }
  }
  (pIVar7->CmdBuffer).Size = iVar1;
  memcpy((pIVar7->CmdBuffer).Data,(this->CmdBuffer).Data,(long)iVar1 * 0x38);
  puVar5 = (pIVar7->IdxBuffer).Data;
  if (puVar5 != (unsigned_short *)0x0) {
    (pIVar7->IdxBuffer).Size = 0;
    (pIVar7->IdxBuffer).Capacity = 0;
    ImGui::MemFree(puVar5);
    (pIVar7->IdxBuffer).Data = (unsigned_short *)0x0;
  }
  iVar1 = (this->IdxBuffer).Size;
  iVar2 = (pIVar7->IdxBuffer).Capacity;
  if (iVar2 < iVar1) {
    if (iVar2 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar2 / 2 + iVar2;
    }
    if (iVar8 <= iVar1) {
      iVar8 = iVar1;
    }
    if (iVar2 < iVar8) {
      __dest_00 = (unsigned_short *)ImGui::MemAlloc((long)iVar8 * 2);
      puVar5 = (pIVar7->IdxBuffer).Data;
      if (puVar5 != (unsigned_short *)0x0) {
        memcpy(__dest_00,puVar5,(long)(pIVar7->IdxBuffer).Size * 2);
        ImGui::MemFree((pIVar7->IdxBuffer).Data);
      }
      (pIVar7->IdxBuffer).Data = __dest_00;
      (pIVar7->IdxBuffer).Capacity = iVar8;
    }
  }
  (pIVar7->IdxBuffer).Size = iVar1;
  memcpy((pIVar7->IdxBuffer).Data,(this->IdxBuffer).Data,(long)iVar1 * 2);
  pIVar6 = (pIVar7->VtxBuffer).Data;
  if (pIVar6 != (ImDrawVert *)0x0) {
    (pIVar7->VtxBuffer).Size = 0;
    (pIVar7->VtxBuffer).Capacity = 0;
    ImGui::MemFree(pIVar6);
    (pIVar7->VtxBuffer).Data = (ImDrawVert *)0x0;
  }
  iVar1 = (this->VtxBuffer).Size;
  iVar2 = (pIVar7->VtxBuffer).Capacity;
  if (iVar2 < iVar1) {
    if (iVar2 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar2 / 2 + iVar2;
    }
    if (iVar8 <= iVar1) {
      iVar8 = iVar1;
    }
    if (iVar2 < iVar8) {
      __dest_01 = (ImDrawVert *)ImGui::MemAlloc((long)iVar8 * 0x14);
      pIVar6 = (pIVar7->VtxBuffer).Data;
      if (pIVar6 != (ImDrawVert *)0x0) {
        memcpy(__dest_01,pIVar6,(long)(pIVar7->VtxBuffer).Size * 0x14);
        ImGui::MemFree((pIVar7->VtxBuffer).Data);
      }
      (pIVar7->VtxBuffer).Data = __dest_01;
      (pIVar7->VtxBuffer).Capacity = iVar8;
    }
  }
  (pIVar7->VtxBuffer).Size = iVar1;
  memcpy((pIVar7->VtxBuffer).Data,(this->VtxBuffer).Data,(long)iVar1 * 0x14);
  pIVar7->Flags = this->Flags;
  return pIVar7;
}

Assistant:

ImDrawList* ImDrawList::CloneOutput() const
{
    ImDrawList* dst = IM_NEW(ImDrawList(_Data));
    dst->CmdBuffer = CmdBuffer;
    dst->IdxBuffer = IdxBuffer;
    dst->VtxBuffer = VtxBuffer;
    dst->Flags = Flags;
    return dst;
}